

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

node * mpt::node::create(size_t len)

{
  NodePrivate *this;
  node *pnVar1;
  
  if (len - 0x11 < 0x48) {
    this = (NodePrivate *)malloc(0x80);
    if (this != (NodePrivate *)0x0) {
      NodePrivate::NodePrivate(this);
      return &this->super_node;
    }
  }
  else {
    pnVar1 = (node *)malloc(0x38);
    if (pnVar1 != (node *)0x0) {
      pnVar1->prev = (node *)0x0;
      pnVar1->parent = (node *)0x0;
      pnVar1->_meta = (metatype *)0x0;
      pnVar1->next = (node *)0x0;
      pnVar1->children = (node *)0x0;
      identifier::identifier(&pnVar1->ident,0x10);
      return pnVar1;
    }
  }
  return (node *)0x0;
}

Assistant:

node *node::create(size_t len)
{
	static const size_t preSize = sizeof(node) - sizeof(identifier);
	void *ptr;
	len += preSize;
	if (len > sizeof(node) && len <= sizeof(NodePrivate)) {
		if (!(ptr = (malloc(sizeof(NodePrivate))))) {
			return 0;
		}
		return new (ptr) NodePrivate();
	}
	if (!(ptr = malloc(sizeof(node)))) {
		return 0;
	}
	return new (ptr) node();
}